

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vertex_sequence.h
# Opt level: O1

void __thiscall
agg::vertex_sequence<agg::vertex_dist,_6U>::add
          (vertex_sequence<agg::vertex_dist,_6U> *this,vertex_dist *val)

{
  vertex_dist **ppvVar1;
  vertex_dist *pvVar2;
  vertex_dist *pvVar3;
  double dVar4;
  uint uVar5;
  double dVar6;
  
  uVar5 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
  if (1 < uVar5) {
    ppvVar1 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks;
    pvVar3 = ppvVar1[uVar5 - 2 >> 6] + (uVar5 - 2 & 0x3f);
    pvVar2 = ppvVar1[uVar5 - 1 >> 6];
    uVar5 = uVar5 - 1 & 0x3f;
    dVar4 = pvVar2[uVar5].x - pvVar3->x;
    dVar6 = pvVar2[uVar5].y - pvVar3->y;
    dVar4 = dVar4 * dVar4 + dVar6 * dVar6;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    pvVar3->dist = (double)(~-(ulong)(1e-14 < dVar4) & 0x42d6bcc41e900000 |
                           (ulong)dVar4 & -(ulong)(1e-14 < dVar4));
    if ((dVar4 <= 1e-14) &&
       (uVar5 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size, uVar5 != 0)) {
      (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size = uVar5 - 1;
    }
  }
  uVar5 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size >> 6;
  if ((this->super_pod_bvector<agg::vertex_dist,_6U>).m_num_blocks <= uVar5) {
    pod_bvector<agg::vertex_dist,_6U>::allocate_block
              (&this->super_pod_bvector<agg::vertex_dist,_6U>,uVar5);
  }
  pvVar3 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks[uVar5];
  uVar5 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size & 0x3f;
  pvVar3[uVar5].dist = val->dist;
  dVar4 = val->y;
  pvVar3 = pvVar3 + uVar5;
  pvVar3->x = val->x;
  pvVar3->y = dVar4;
  (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size =
       (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size + 1;
  return;
}

Assistant:

void vertex_sequence<T, S>::add(const T& val)
    {
        if(base_type::size() > 1)
        {
            if(!(*this)[base_type::size() - 2]((*this)[base_type::size() - 1])) 
            {
                base_type::remove_last();
            }
        }
        base_type::add(val);
    }